

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O0

void __thiscall QCborStreamReader::QCborStreamReader(QCborStreamReader *this,QIODevice *device)

{
  QCborStreamReader *this_00;
  QIODevice *device_00;
  undefined1 *puVar1;
  long in_RDI;
  pointer in_stack_ffffffffffffffb8;
  unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
  *in_stack_ffffffffffffffc0;
  QCborStreamReaderPrivate *in_stack_ffffffffffffffe0;
  
  this_00 = (QCborStreamReader *)(in_RDI + 8);
  device_00 = (QIODevice *)operator_new(0x78);
  QCborStreamReaderPrivate::QCborStreamReaderPrivate(in_stack_ffffffffffffffe0,device_00);
  std::unique_ptr<QCborStreamReaderPrivate,std::default_delete<QCborStreamReaderPrivate>>::
  unique_ptr<std::default_delete<QCborStreamReaderPrivate>,void>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  puVar1 = (undefined1 *)(in_RDI + 0x11);
  do {
    *puVar1 = 0;
    puVar1 = puVar1 + 1;
  } while (puVar1 != (undefined1 *)(in_RDI + 0x14));
  preparse(this_00);
  return;
}

Assistant:

QCborStreamReader::QCborStreamReader(QIODevice *device)
    : d(new QCborStreamReaderPrivate(device))
{
    preparse();
}